

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::make_init_node_0
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this)

{
  float fVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  uint local_1c [2];
  float local_14;
  branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *local_10;
  branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this_local;
  
  local_14 = 0.0;
  local_1c[1] = 0;
  local_1c[0] = 0;
  local_10 = this;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node>>
  ::emplace_back<float,int,unsigned_int>
            ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node>>
              *)&this->nodes,&local_14,(int *)(local_1c + 1),local_1c);
  sVar2 = shared_subvector::emplace(&this->subvector);
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ::back(&this->nodes);
  pvVar3->variables = sVar2;
  pvVar4 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
           ::operator[](&this->items,1);
  fVar1 = pvVar4->sum_z;
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ::back(&this->nodes);
  pvVar3->z = fVar1;
  pvVar3 = std::
           vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ::back(&this->nodes);
  shared_subvector::fill(&this->subvector,pvVar3->variables,'\0');
  return;
}

Assistant:

void make_init_node_0()
    {
        nodes.emplace_back(Float{ 0 }, 0, 0u);
        nodes.back().variables = subvector.emplace();
        nodes.back().z = items[1].sum_z;

        subvector.fill(nodes.back().variables, 0);
    }